

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_combinatoric_flip_many_64(void **param_1)

{
  uint64_t expected_cardinality;
  uint64_t last_bucket;
  uint64_t first_bucket;
  uint64_t value;
  uint32_t slot;
  uint32_t bit_index;
  uint32_t num_one_bits;
  Roaring64Map roaring;
  uint32_t bitmask;
  uint32_t bitmask_limit;
  uint32_t base_slot;
  uint32_t num_slots_to_test;
  int in_stack_ffffffffffffff5c;
  Roaring64Map *in_stack_ffffffffffffff60;
  uint64_t in_stack_ffffffffffffff68;
  Roaring64Map *in_stack_ffffffffffffff70;
  Roaring64Map *in_stack_ffffffffffffff90;
  undefined4 local_58;
  undefined4 local_54;
  uint64_t in_stack_ffffffffffffffe0;
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar4 = 5;
  uVar3 = 0x32;
  uVar2 = 0x20;
  for (uVar1 = 0; uVar1 < 0x20; uVar1 = uVar1 + 1) {
    ::roaring::Roaring64Map::Roaring64Map(in_stack_ffffffffffffff60);
    local_54 = 0;
    for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
      if ((uVar1 & 1 << ((byte)local_58 & 0x1f)) != 0) {
        ::roaring::Roaring64Map::add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        local_54 = local_54 + 1;
      }
    }
    ::roaring::Roaring64Map::flipClosed
              ((Roaring64Map *)CONCAT44(uVar4,uVar3),CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffe0
              );
    in_stack_ffffffffffffff60 = (Roaring64Map *)(0x500000000 - (ulong)local_54);
    in_stack_ffffffffffffff70 = in_stack_ffffffffffffff60;
    in_stack_ffffffffffffff68 = ::roaring::Roaring64Map::cardinality(in_stack_ffffffffffffff90);
    _assert_int_equal((unsigned_long)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                      (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    ::roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x110bbb);
  }
  return;
}

Assistant:

DEFINE_TEST(test_combinatoric_flip_many_64) {
    // Given 'num_slots_to_test' outer slots, we repeatedly seed a Roaring64Map
    // with all combinations of present and absent outer slots (basically the
    // powerset of {0...num_slots_to_test - 1}), then we add_range_closed
    // and see if the cardinality is what we expect.
    //
    // For example (assuming num_slots_to_test = 5), the iterations of the outer
    // loop represent these sets:
    // 1. {}
    // 2. {0}
    // 3. {1}
    // 4. {0, 1}
    // 5. {2}
    // 6. {0, 2}
    // 7. {1, 2}
    // 8. {0, 1, 2}
    // 9. {3}
    // and so forth...
    //
    // For example, in step 6 (representing set {0, 2}) we set a bit somewhere
    // in slot 0 and we set another bit somehwere in slot 2. The purpose of this
    // is to make sure 'flipClosed' does the right thing when it encounters
    // an arbitrary mix of present and absent slots. Then we call
    // 'flipClosed' over the whole range and confirm that the cardinality
    // is what we expect.
    const uint32_t num_slots_to_test = 5;
    const uint32_t base_slot = 50;

    const uint32_t bitmask_limit = 1 << num_slots_to_test;

    for (uint32_t bitmask = 0; bitmask < bitmask_limit; ++bitmask) {
        Roaring64Map roaring;
        uint32_t num_one_bits = 0;

        // The 1-bits in 'bitmask' indicate which slots we want to seed
        // with a value.
        for (uint32_t bit_index = 0; bit_index < num_slots_to_test;
             ++bit_index) {
            if ((bitmask & (1 << bit_index)) == 0) {
                continue;
            }
            auto slot = base_slot + bit_index;
            auto value = (uint64_t(slot) << 32) + 0x1234567 + bit_index;
            roaring.add(value);
            ++num_one_bits;
        }

        auto first_bucket = uint64_t(base_slot) << 32;
        auto last_bucket = uint64_t(base_slot + num_slots_to_test - 1) << 32;

        roaring.flipClosed(first_bucket, last_bucket + uint32_max);

        // Slots not initalized with a bit will now have cardinality 2^32
        // Slots initialized with a bit will have cardinality 2^32 - 1
        auto expected_cardinality =
            num_slots_to_test * (uint64_t(1) << 32) - num_one_bits;
        assert_int_equal(expected_cardinality, roaring.cardinality());
    }
}